

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall chatra::Package::Package(Package *this,RuntimeImp *runtime,Reader *r)

{
  Reader *r_local;
  RuntimeImp *runtime_local;
  Package *this_local;
  
  PackageInfo::PackageInfo(&this->super_PackageInfo);
  IdType<chatra::PackageId,_chatra::Package>::IdType
            (&this->super_IdType<chatra::PackageId,_chatra::Package>);
  IClassFinder::IClassFinder(&this->super_IClassFinder);
  PackageContext::PackageContext(&this->super_PackageContext);
  (this->super_IClassFinder)._vptr_IClassFinder = (_func_int **)&PTR__Package_0042a048;
  (this->super_PackageContext)._vptr_PackageContext = (_func_int **)&PTR__Package_0042a098;
  this->runtime = runtime;
  std::atomic<bool>::atomic(&this->initialized,false);
  this->temporaryInitialized = false;
  std::__cxx11::string::string((string *)&this->name);
  std::unique_ptr<chatra::Scope,std::default_delete<chatra::Scope>>::
  unique_ptr<std::default_delete<chatra::Scope>,void>
            ((unique_ptr<chatra::Scope,std::default_delete<chatra::Scope>> *)&this->scope);
  std::vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>::
  vector(&this->lines);
  this->fromHost = false;
  this->grouped = false;
  this->hasDefOperator = false;
  SpinLock::SpinLock(&this->lockNode);
  std::shared_ptr<chatra::Node>::shared_ptr(&this->node);
  std::vector<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>::vector
            (&this->threadsWaitingForNode);
  SpinLock::SpinLock(&this->lockInstances);
  std::
  unordered_map<chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>,_std::hash<chatra::InstanceId>,_std::equal_to<chatra::InstanceId>,_std::allocator<std::pair<const_chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>_>_>_>
  ::unordered_map(&this->instances);
  std::unique_ptr<chatra::Class,std::default_delete<chatra::Class>>::
  unique_ptr<std::default_delete<chatra::Class>,void>
            ((unique_ptr<chatra::Class,std::default_delete<chatra::Class>> *)&this->clPackage);
  ClassTable::ClassTable(&this->classes);
  std::
  unordered_set<chatra::StringId,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<chatra::StringId>_>
  ::unordered_set(&this->imports);
  std::
  unordered_map<chatra::StringId,_chatra::Package_*,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Package_*>_>_>
  ::unordered_map(&this->importsByName);
  std::vector<chatra::Package_*,_std::allocator<chatra::Package_*>_>::vector
            (&this->anonymousImports);
  return;
}

Assistant:

Package::Package(RuntimeImp& runtime, Reader& r) noexcept : runtime(runtime) {
	(void)r;
}